

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int32_To_Int8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt32 PVar1;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  int in_R8D;
  PaUtilTriangularDitherGenerator *in_R9;
  PaInt32 dither;
  char *dest;
  PaInt32 *src;
  undefined1 *local_38;
  int *local_30;
  int local_20;
  
  local_38 = in_RDI;
  local_30 = in_RDX;
  local_20 = in_R8D;
  while (local_20 != 0) {
    PVar1 = PaUtil_Generate16BitTriangularDither(in_R9);
    *local_38 = (char)((*local_30 >> 1) + PVar1 >> 0x17);
    local_30 = local_30 + in_ECX;
    local_38 = local_38 + in_ESI;
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

static void Int32_To_Int8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt32 *src = (PaInt32*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    PaInt32 dither;

    while( count-- )
    {
        /* REVIEW */
        dither = PaUtil_Generate16BitTriangularDither( ditherGenerator );
        *dest = (signed char) ((((*src)>>1) + dither) >> 23);

        src += sourceStride;
        dest += destinationStride;
    }
}